

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_test_target.cc
# Opt level: O3

void __thiscall highwayhash::VectorTest<2U>::operator()(VectorTest<2U> *this,HHNotify notify)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  HHNotify in_RCX;
  __m128i *p;
  bool bVar4;
  size_t i;
  long lVar5;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  uchar lanes [32];
  unsigned_long lanes_3 [2];
  undefined8 local_a0;
  undefined1 uStack_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  char local_90;
  undefined1 uStack_8f;
  undefined2 uStack_8e;
  undefined4 uStack_8c;
  short asStack_88 [4];
  undefined1 local_80 [2] [16];
  undefined8 local_60;
  undefined8 uStack_58;
  
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0x2,'c',(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0x3,'i',(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0xff,'m',(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0x2,'r',(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0x2,'w',(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0x5,'z',(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0x1,'}',(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0x2,0x80,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0x7,0x83,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0x1,0x86,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x2,99,(size_t)notify,in_RCX);
  pmovsxbw(extraout_XMM0,0x303030303030303);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x3,0x69,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0xffff,0x6d,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x2,0x72,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x2,0x77,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x5,0x7a,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x1,0x7d,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x2,0x80,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x7,0x83,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x1,0x86,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x2,99,(size_t)notify,in_RCX);
  pmovsxbd(extraout_XMM0_00,0x3030303);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x3,0x69,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0xffffffff,0x6d,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x2,0x72,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x2,0x77,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x5,0x7a,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x1,0x7d,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x2,0x80,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x7,0x83,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x1,0x86,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x0,0x8e,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x2,0x91,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x8000,0x97,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x0,0x9b,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x0,0x8e,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x2,0x91,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x80000000,0x97,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x0,0x9b,(size_t)notify,in_RCX);
  local_a0._0_1_ = 4;
  local_a0._1_1_ = 4;
  local_a0._2_1_ = 4;
  local_a0._3_1_ = 4;
  local_a0._4_1_ = 4;
  local_a0._5_1_ = 4;
  local_a0._6_1_ = 4;
  local_a0._7_1_ = 4;
  uStack_98 = 4;
  uStack_97 = 4;
  uStack_96 = 4;
  uStack_95 = 4;
  uStack_94 = 4;
  uStack_93 = 4;
  uStack_92 = 4;
  uStack_91 = 4;
  local_90 = '\x05';
  uStack_8f = 5;
  uStack_8e = 0x505;
  uStack_8c = 0x5050505;
  asStack_88[0] = 0x505;
  asStack_88[1] = 0x505;
  asStack_88[2] = 0x505;
  asStack_88[3] = 0x505;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0x4,0xaa,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((V<unsigned_char> *)0x4,0xaf,(size_t)notify,in_RCX);
  local_80[0][1] = local_a0._2_1_;
  local_80[0][0] = local_a0._1_1_;
  local_80[0][2] = local_a0._3_1_;
  local_80[0][3] = local_a0._4_1_;
  local_80[0][4] = local_a0._5_1_;
  local_80[0][5] = local_a0._6_1_;
  local_80[0][6] = local_a0._7_1_;
  local_80[0][7] = uStack_98;
  local_80[0][8] = uStack_97;
  local_80[0][9] = uStack_96;
  local_80[0][10] = uStack_95;
  local_80[0][0xb] = uStack_94;
  local_80[0][0xc] = uStack_93;
  local_80[0][0xd] = uStack_92;
  local_80[0][0xe] = uStack_91;
  local_80[0][0xf] = local_90;
  if (local_90 != '\x05') {
    pcVar2 = TargetName(2);
    (*notify)(pcVar2,0xb40001);
  }
  lVar5 = 1;
  do {
    if (local_80[0][lVar5] != '\x04') {
      pcVar2 = TargetName(2);
      (*notify)(pcVar2,0xb60001);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xf);
  uStack_98 = 4;
  uStack_97 = 4;
  uStack_96 = 4;
  uStack_95 = 4;
  uStack_94 = 4;
  uStack_93 = 4;
  uStack_92 = 4;
  uStack_91 = 4;
  local_90 = 4;
  uStack_8f = 4;
  uStack_8e = 0x404;
  uStack_8c = 0x4040404;
  lVar5 = 0;
  do {
    if (*(char *)((long)&local_a0 + lVar5) != '\x04') {
      pcVar2 = TargetName(2);
      (*notify)(pcVar2,0xbd0001);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x18);
  lVar5 = 0x18;
  do {
    if (*(char *)((long)&local_a0 + lVar5) != '\x05') {
      pcVar2 = TargetName(2);
      (*notify)(pcVar2,0xc10001);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x20);
  local_a0._0_1_ = 4;
  local_a0._1_1_ = 0;
  local_a0._2_1_ = 4;
  local_a0._3_1_ = 0;
  local_a0._4_1_ = 4;
  local_a0._5_1_ = 0;
  local_a0._6_1_ = 4;
  local_a0._7_1_ = 0;
  uStack_98 = 4;
  uStack_97 = 0;
  uStack_96 = 4;
  uStack_95 = 0;
  uStack_94 = 4;
  uStack_93 = 0;
  uStack_92 = 4;
  uStack_91 = 0;
  local_90 = 5;
  uStack_8f = 0;
  uStack_8e = 5;
  uStack_8c = 0x50005;
  asStack_88[0] = 5;
  asStack_88[1] = 5;
  asStack_88[2] = 5;
  asStack_88[3] = 5;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x4,0xaa,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)0x4,0xaf,(size_t)notify,in_RCX);
  local_80[0][1] = local_a0._3_1_;
  local_80[0][0] = local_a0._2_1_;
  local_80[0][3] = local_a0._5_1_;
  local_80[0][2] = local_a0._4_1_;
  local_80[0][5] = local_a0._7_1_;
  local_80[0][4] = local_a0._6_1_;
  local_80[0][7] = uStack_97;
  local_80[0][6] = uStack_98;
  local_80[0][9] = uStack_95;
  local_80[0][8] = uStack_96;
  local_80[0][0xb] = uStack_93;
  local_80[0][10] = uStack_94;
  local_80[0][0xd] = uStack_91;
  local_80[0][0xc] = uStack_92;
  local_80[0]._14_2_ = CONCAT11(uStack_8f,local_90);
  if (CONCAT11(uStack_8f,local_90) != 5) {
    pcVar2 = TargetName(2);
    (*notify)(pcVar2,0xb40002);
  }
  lVar5 = 1;
  do {
    if (*(short *)(local_80[0] + lVar5 * 2) != 4) {
      pcVar2 = TargetName(2);
      (*notify)(pcVar2,0xb60002);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 7);
  uStack_98 = 4;
  uStack_97 = 0;
  uStack_96 = 4;
  uStack_95 = 0;
  uStack_94 = 4;
  uStack_93 = 0;
  uStack_92 = 4;
  uStack_91 = 0;
  local_90 = 4;
  uStack_8f = 0;
  uStack_8e = 4;
  uStack_8c = 0x40004;
  lVar5 = 0;
  do {
    if (*(short *)((long)&local_a0 + lVar5 * 2) != 4) {
      pcVar2 = TargetName(2);
      (*notify)(pcVar2,0xbd0002);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xc);
  lVar5 = 0xc;
  do {
    if (*(short *)((long)&local_a0 + lVar5 * 2) != 5) {
      pcVar2 = TargetName(2);
      (*notify)(pcVar2,0xc10002);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  local_a0._0_1_ = 4;
  local_a0._1_1_ = 0;
  local_a0._2_1_ = 0;
  local_a0._3_1_ = 0;
  local_a0._4_1_ = 4;
  local_a0._5_1_ = 0;
  local_a0._6_1_ = 0;
  local_a0._7_1_ = 0;
  uStack_98 = 4;
  uStack_97 = 0;
  uStack_96 = 0;
  uStack_95 = 0;
  uStack_94 = 4;
  uStack_93 = 0;
  uStack_92 = 0;
  uStack_91 = 0;
  local_90 = 5;
  uStack_8f = 0;
  uStack_8e = 0;
  uStack_8c = 5;
  asStack_88[0] = 5;
  asStack_88[1] = 0;
  asStack_88[2] = 5;
  asStack_88[3] = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x4,0xaa,(size_t)notify,in_RCX);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)0x4,0xaf,(size_t)notify,in_RCX);
  local_80[0][1] = local_a0._5_1_;
  local_80[0][0] = local_a0._4_1_;
  local_80[0][2] = local_a0._6_1_;
  local_80[0][3] = local_a0._7_1_;
  local_80[0][4] = uStack_98;
  local_80[0][5] = uStack_97;
  local_80[0][6] = uStack_96;
  local_80[0][7] = uStack_95;
  local_80[0][8] = uStack_94;
  local_80[0][9] = uStack_93;
  local_80[0][10] = uStack_92;
  local_80[0][0xb] = uStack_91;
  local_80[0][0xc] = local_90;
  local_80[0][0xd] = uStack_8f;
  local_80[0]._14_2_ = uStack_8e;
  uVar3 = extractps(local_80[0],3);
  if ((int)uVar3 != 5) {
    pcVar2 = TargetName(2);
    (*notify)(pcVar2,0xb40004);
  }
  lVar5 = 1;
  do {
    if (*(int *)(local_80[0] + lVar5 * 4) != 4) {
      pcVar2 = TargetName(2);
      (*notify)(pcVar2,0xb60004);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  uStack_98 = 4;
  uStack_97 = 0;
  uStack_96 = 0;
  uStack_95 = 0;
  uStack_94 = 4;
  uStack_93 = 0;
  uStack_92 = 0;
  uStack_91 = 0;
  local_90 = 4;
  uStack_8f = 0;
  uStack_8e = 0;
  uStack_8c = 4;
  lVar5 = 0;
  do {
    if (*(int *)((long)&local_a0 + lVar5 * 4) != 4) {
      pcVar2 = TargetName(2);
      (*notify)(pcVar2,0xbd0004);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  lVar5 = 6;
  do {
    if (*(int *)((long)&local_a0 + lVar5 * 4) != 5) {
      pcVar2 = TargetName(2);
      (*notify)(pcVar2,0xc10004);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  local_a0._0_1_ = 4;
  local_a0._1_1_ = 0;
  local_a0._2_1_ = 0;
  local_a0._3_1_ = 0;
  local_a0._4_1_ = 0;
  local_a0._5_1_ = 0;
  local_a0._6_1_ = 0;
  local_a0._7_1_ = 0;
  asStack_88[0] = 5;
  asStack_88[1] = 0;
  asStack_88[2] = 0;
  asStack_88[3] = 0;
  local_60 = 4;
  uStack_58 = 4;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    bVar1 = false;
  } while (bVar4);
  bVar1 = true;
  do {
    bVar4 = bVar1;
    bVar1 = false;
  } while (bVar4);
  uStack_98 = 4;
  uStack_97 = 0;
  uStack_96 = 0;
  uStack_95 = 0;
  uStack_94 = 0;
  uStack_93 = 0;
  uStack_92 = 0;
  uStack_91 = 0;
  local_90 = 4;
  uStack_8f = 0;
  uStack_8e = 0;
  uStack_8c = 0;
  lVar5 = 0;
  do {
    if ((&local_a0)[lVar5] != 4) {
      pcVar2 = TargetName(2);
      (*notify)(pcVar2,0xbd0008);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  return;
}

Assistant:

void VectorTest<Target>::operator()(const HHNotify notify) const {
  HH_TARGET_NAME::TestAll(notify);
}